

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O3

void unqliteBitvecDestroy(Bitvec *p)

{
  sxu32 *psVar1;
  SyMemBackend *pBackend;
  bitvec_rec *pbVar2;
  bitvec_rec *pbVar3;
  
  pBackend = p->pAlloc;
  if (p->nRec != 0) {
    pbVar3 = p->pList;
    do {
      pbVar2 = pbVar3->pNext;
      SyMemBackendPoolFree(pBackend,pbVar3);
      psVar1 = &p->nRec;
      *psVar1 = *psVar1 - 1;
      if (*psVar1 == 0) break;
      pbVar3 = pbVar2->pNext;
      SyMemBackendPoolFree(pBackend,pbVar2);
      psVar1 = &p->nRec;
      *psVar1 = *psVar1 - 1;
      if (*psVar1 == 0) break;
      pbVar2 = pbVar3->pNext;
      SyMemBackendPoolFree(pBackend,pbVar3);
      psVar1 = &p->nRec;
      *psVar1 = *psVar1 - 1;
      if (*psVar1 == 0) break;
      pbVar3 = pbVar2->pNext;
      SyMemBackendPoolFree(pBackend,pbVar2);
      psVar1 = &p->nRec;
      *psVar1 = *psVar1 - 1;
    } while (*psVar1 != 0);
  }
  SyMemBackendFree(pBackend,p->apRec);
  SyMemBackendFree(pBackend,p);
  return;
}

Assistant:

UNQLITE_PRIVATE void unqliteBitvecDestroy(Bitvec *p)
{
	bitvec_rec *pNext,*pRec = p->pList;
	SyMemBackend *pAlloc = p->pAlloc;
	
	for(;;){
		if( p->nRec < 1 ){
			break;
		}
		pNext = pRec->pNext;
		SyMemBackendPoolFree(pAlloc,(void *)pRec);
		pRec = pNext;
		p->nRec--;

		if( p->nRec < 1 ){
			break;
		}
		pNext = pRec->pNext;
		SyMemBackendPoolFree(pAlloc,(void *)pRec);
		pRec = pNext;
		p->nRec--;


		if( p->nRec < 1 ){
			break;
		}
		pNext = pRec->pNext;
		SyMemBackendPoolFree(pAlloc,(void *)pRec);
		pRec = pNext;
		p->nRec--;


		if( p->nRec < 1 ){
			break;
		}
		pNext = pRec->pNext;
		SyMemBackendPoolFree(pAlloc,(void *)pRec);
		pRec = pNext;
		p->nRec--;
	}
	SyMemBackendFree(pAlloc,(void *)p->apRec);
	SyMemBackendFree(pAlloc,p);
}